

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

void __thiscall OneLevel_InsertSecondNode_Test::TestBody(OneLevel_InsertSecondNode_Test *this)

{
  database *db;
  test_trie *ptVar1;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar2;
  uint generation;
  value_reference_type rhs;
  index_pointer *piVar3;
  pointer *__ptr;
  index_pointer iVar4;
  char *pcVar5;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr_2;
  internal_node *this_01;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  transaction_type t1;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  itp;
  index_pointer local_288;
  index_pointer local_280;
  undefined1 local_278 [8];
  index_pointer local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  index_pointer local_258;
  index_pointer local_250;
  transaction<std::unique_lock<mock_mutex>_> local_248;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [13];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_128;
  bool local_120;
  undefined1 local_118 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_30;
  
  db = &(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.db_;
  local_210._0_8_ = &(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.field_0x10;
  local_210[8] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_210);
  local_210[8] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_248,db,(unique_lock<mock_mutex> *)local_210);
  if (((bool)local_210[8] == true) && ((mutex_type *)local_210._0_8_ != (mutex_type *)0x0)) {
    local_210[8] = false;
  }
  ptVar1 = (this->super_OneLevel).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_210._0_8_ = (mutex_type *)(local_210 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"a","");
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_118,ptVar1,&local_248,(string *)local_210);
  if (local_30._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_30,local_30._M_head_impl);
  }
  local_30._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((mutex_type *)local_210._0_8_ != (mutex_type *)(local_210 + 0x10)) {
    operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
  }
  ptVar1 = (this->super_OneLevel).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  pcVar6 = local_278 + 0x10;
  local_278 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"b","");
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_210,ptVar1,&local_248,(string *)local_278);
  if (local_278 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  rhs = pstore::index::
        hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::iterator_base<false>::operator*((iterator_base<false> *)local_210);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_278,"\"b\"","key",(char (*) [2])0x216c05,&rhs->first);
  if (local_278[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_258.addr_);
    if (local_270.internal_ == (internal_node *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)((local_270.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288.addr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1e6,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_288.addr_,(Message *)&local_258.addr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288.addr_);
    if (local_258.internal_ != (internal_node *)0x0) {
      (**(code **)(*(long *)((local_258.internal_)->signature_)._M_elems + 8))();
    }
  }
  if (local_270.internal_ != (internal_node *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_278 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_270.internal_);
  }
  local_258.addr_.a_._0_1_ = local_120;
  local_250.internal_ = (internal_node *)0x0;
  if (local_120 == false) {
    testing::Message::Message((Message *)&local_288.addr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&local_258.addr_,(AssertionResult *)"itp.second",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280.addr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1e7,(char *)local_278);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_280.addr_,(Message *)&local_288.addr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280.addr_);
    if (local_278 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
    }
    if (local_288.internal_ != (internal_node *)0x0) {
      (**(code **)(*(long *)((local_288.internal_)->signature_)._M_elems + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_250.addr_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_250.internal_);
  }
  local_288.addr_.a_._0_4_ = 2;
  local_258 = (index_pointer)
              ((this->super_OneLevel).index_._M_t.
               super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
              ._M_head_impl)->size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_278,"2U","index_->size ()",(uint *)&local_288,
             (unsigned_long *)&local_258);
  if (local_278[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_258.addr_);
    if (local_270.internal_ == (internal_node *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)((local_270.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288.addr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1e8,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_288.addr_,(Message *)&local_258.addr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288.addr_);
    if (local_258.internal_ != (internal_node *)0x0) {
      (**(code **)(*(long *)((local_258.internal_)->signature_)._M_elems + 8))();
    }
  }
  if (local_270.internal_ != (internal_node *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_278 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_270.internal_);
  }
  ptVar1 = (this->super_OneLevel).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_278 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"b","");
  bVar2 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,ptVar1,(string *)local_278);
  local_258.addr_.a_._0_1_ = bVar2;
  local_250.internal_ = (internal_node *)0x0;
  if (local_278 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  if (local_258.addr_.a_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_288.addr_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_288.linear_)->leaves_,"key \"b\" should be present in the index",
               0x26);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&local_258.addr_,
               (AssertionResult *)"this->is_found (*index_, \"b\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280.addr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1e9,(char *)local_278);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_280.addr_,(Message *)&local_288.addr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280.addr_);
    if (local_278 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
    }
    if (local_288.internal_ != (internal_node *)0x0) {
      (**(code **)(*(long *)((local_288.internal_)->signature_)._M_elems + 8))();
    }
  }
  iVar4 = local_250;
  if (local_250.internal_ != (internal_node *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_250.addr_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_250.internal_);
  }
  local_258 = (index_pointer)
              (((this->super_OneLevel).index_._M_t.
                super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
               ._M_head_impl)->root_).internal_;
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_heap_internal_node
            ((GenericIndexFixture *)local_258.internal_,iVar4);
  this_01 = local_258.internal_ & 0xfffffffffffffffc;
  local_288 = (index_pointer)this_01->bitmap_;
  local_280.addr_.a_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_278,"root_internal->get_bitmap ()","0b1010U",
             (unsigned_long *)&local_288,(uint *)&local_280);
  if (local_278[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_288.addr_);
    if (local_270.internal_ == (internal_node *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)((local_270.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280.addr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1ef,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_280.addr_,(Message *)&local_288.addr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280.addr_);
    if (local_288.internal_ != (internal_node *)0x0) {
      (**(code **)(*(long *)((local_288.internal_)->signature_)._M_elems + 8))();
    }
  }
  if (local_270.internal_ != (internal_node *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_278 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_270.internal_);
  }
  iVar4.internal_ = (internal_node *)0x0;
  piVar3 = pstore::index::details::internal_node::operator[](this_01,0);
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)piVar3->internal_,iVar4);
  iVar4 = (index_pointer)0x1;
  piVar3 = pstore::index::details::internal_node::operator[](this_01,1);
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)piVar3->internal_,iVar4);
  piVar3 = pstore::index::details::internal_node::operator[](this_01,0);
  if (((ulong)*piVar3 & 2) == 0) {
    local_288 = *piVar3;
    piVar3 = pstore::index::details::internal_node::operator[](this_01,1);
    if (((ulong)*piVar3 & 2) == 0) {
      local_280 = *piVar3;
      testing::internal::CmpHelperGT<pstore::address,pstore::address>
                ((internal *)local_278,"(*root_internal)[0].to_address ()",
                 "(*root_internal)[1].to_address ()",&local_288.addr_,&local_280.addr_);
      if (local_278[0] == (string)0x0) {
        testing::Message::Message((Message *)&local_288.addr_);
        if (local_270.internal_ == (internal_node *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)((local_270.internal_)->signature_)._M_elems;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_280.addr_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                   ,0x1f2,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_280.addr_,(Message *)&local_288.addr_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280.addr_);
        if (local_288.internal_ != (internal_node *)0x0) {
          (**(code **)(*(long *)((local_288.internal_)->signature_)._M_elems + 8))();
        }
      }
      if (local_270.internal_ != (internal_node *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_278 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_270.internal_);
      }
      this_00 = (this->super_OneLevel).index_._M_t.
                super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                ._M_head_impl;
      generation = pstore::database::get_current_revision(db);
      pstore::index::
      hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::flush(this_00,&local_248.super_transaction_base,generation);
      local_288 = ((this->super_OneLevel).index_._M_t.
                   super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                  ._M_head_impl)->root_;
      testing::internal::
      CmpHelperNE<pstore::index::details::index_pointer,pstore::index::details::index_pointer>
                ((internal *)local_278,"root","index_->root ()",&local_258,&local_288);
      if (local_278[0] == (string)0x0) {
        testing::Message::Message((Message *)&local_288.addr_);
        if (local_270.internal_ == (internal_node *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)((local_270.internal_)->signature_)._M_elems;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_280.addr_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                   ,500,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_280.addr_,(Message *)&local_288.addr_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280.addr_);
        if (local_288.internal_ != (internal_node *)0x0) {
          (**(code **)(*(long *)((local_288.internal_)->signature_)._M_elems + 8))();
        }
      }
      if (local_270.internal_ != (internal_node *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_278 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_270.internal_);
      }
      anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_store_internal_node
                ((GenericIndexFixture *)
                 (((this->super_OneLevel).index_._M_t.
                   super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                  ._M_head_impl)->root_).internal_,local_270);
      if (local_128._M_head_impl !=
          (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        std::
        default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_128,local_128._M_head_impl);
      }
      local_248.super_transaction_base._vptr_transaction_base =
           (_func_int **)&PTR__transaction_00271290;
      pstore::transaction_base::rollback(&local_248.super_transaction_base);
      return;
    }
  }
  __assert_fail("is_address ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
}

Assistant:

TEST_F (OneLevel, InsertSecondNode) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "a");
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "b");
    std::string const & key = (*itp.first).first;
    EXPECT_EQ ("b", key);
    EXPECT_TRUE (itp.second);
    EXPECT_EQ (2U, index_->size ());
    EXPECT_TRUE (this->is_found (*index_, "b")) << "key \"b\" should be present in the index";
    {
        // Check that the root is in heap as we expected.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b1010U);
        this->check_is_leaf_node ((*root_internal)[0]);
        this->check_is_leaf_node ((*root_internal)[1]);
        EXPECT_GT ((*root_internal)[0].to_address (), (*root_internal)[1].to_address ());
        index_->flush (t1, db_.get_current_revision ());
        EXPECT_NE (root, index_->root ());
        this->check_is_store_internal_node (index_->root ());
    }
}